

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  shared_ptr<SimpleCyclic::Cyclic> simpleCyclic;
  Cyclic *local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  
  SimpleCyclic::Cyclic::create();
  SimpleCyclic::Cyclic::doSomething(local_18);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_10);
  return 0;
}

Assistant:

int main()
{
    auto simpleCyclic = SimpleCyclic::Cyclic::create();
    simpleCyclic->doSomething();

    return 0;
}